

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O1

sexp_conflict sexp_sweep(sexp_conflict ctx,size_t *sum_freed_ptr)

{
  sexp_free_list psVar1;
  sexp_uint_t sVar2;
  char *pcVar3;
  sexp_free_list_conflict psVar4;
  sexp_free_list psVar5;
  sexp psVar6;
  long lVar7;
  sexp_uint_t sVar8;
  sexp_uint_t sVar9;
  sexp_heap_conflict psVar10;
  sexp_conflict psVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  sexp_free_list psVar15;
  sexp_free_list_conflict psVar16;
  ulong uVar17;
  
  psVar10 = (ctx->value).context.heap;
  if (psVar10 == (sexp_heap_conflict)0x0) {
    psVar11 = (sexp_conflict)&DAT_00000001;
    sVar12 = 0;
  }
  else {
    uVar13 = 0;
    sVar12 = 0;
    do {
      sVar2 = psVar10->size;
      if (0x20 < (long)sVar2) {
        pcVar3 = psVar10->data;
        psVar4 = psVar10->free_list;
        psVar15 = (sexp_free_list)(pcVar3 + 0x20);
        psVar5 = psVar4;
LAB_0010c8fc:
        do {
          psVar16 = psVar5;
          psVar5 = psVar16->next;
          if (psVar5 != (sexp_free_list)0x0) {
            if (psVar5 < psVar15) goto LAB_0010c8fc;
          }
          if (psVar5 == psVar15) {
            psVar15 = (sexp_free_list)((long)&psVar15->size + psVar5->size);
          }
          else {
            uVar14 = 0x20;
            if (((ulong)psVar15 & 3) == 0) {
              uVar17 = (ulong)(uint)psVar15->size;
              psVar6 = (ctx->value).type.setters;
              if ((long)uVar17 < (long)(psVar6->value).type.id >> 1) {
                lVar7 = *(long *)((long)&((psVar6->value).type.getters)->value + uVar17 * 8 + 8);
                uVar14 = (long)*(short *)(lVar7 + 0x5e) +
                         (ulong)*(ushort *)(lVar7 + 0x62) *
                         *(long *)((long)&psVar15->size + (long)*(short *)(lVar7 + 0x60)) + 0x1f &
                         0xffffffffffffffe0;
              }
            }
            if (*(char *)((long)&psVar15->size + 4) == '\0') {
              sVar8 = psVar16->size;
              if (psVar16 == psVar4 || (sexp_free_list)((long)&psVar16->size + sVar8) != psVar15) {
                if (((psVar5 == (sexp_free_list)0x0) || (psVar5->size == 0)) ||
                   ((sexp_free_list)((long)&psVar15->size + uVar14) != psVar5)) {
                  psVar15->size = uVar14;
                  psVar15->next = psVar5;
                  psVar16->next = psVar15;
                  uVar17 = uVar14;
                }
                else {
                  psVar15->size = psVar5->size + uVar14;
                  psVar15->next = psVar5->next;
                  psVar16->next = psVar15;
                  uVar17 = psVar5->size + uVar14;
                }
                psVar15 = (sexp_free_list)((long)&psVar15->size + uVar17);
              }
              else {
                if (((psVar5 == (sexp_free_list)0x0) || (sVar9 = psVar5->size, sVar9 == 0)) ||
                   (psVar1 = (sexp_free_list)((long)&psVar15->size + uVar14), psVar1 != psVar5)) {
                  uVar17 = sVar8 + uVar14;
                  psVar15 = (sexp_free_list)((long)&psVar15->size + uVar14);
                }
                else {
                  psVar16->next = psVar5->next;
                  uVar17 = sVar8 + uVar14 + sVar9;
                  psVar15 = (sexp_free_list)((long)&psVar1->size + sVar9);
                }
                psVar16->size = uVar17;
              }
              sVar12 = sVar12 + uVar14;
              if (uVar13 < uVar17) {
                uVar13 = uVar17;
              }
            }
            else {
              *(char *)((long)&psVar15->size + 4) = '\0';
              psVar15 = (sexp_free_list)((long)&psVar15->size + uVar14);
            }
          }
          psVar5 = psVar16;
        } while (psVar15 < (sexp_free_list)(pcVar3 + sVar2));
      }
      psVar10 = psVar10->next;
    } while (psVar10 != (sexp_heap)0x0);
    psVar11 = (sexp_conflict)(uVar13 * 2 + 1);
  }
  if (sum_freed_ptr != (size_t *)0x0) {
    *sum_freed_ptr = sVar12;
  }
  return psVar11;
}

Assistant:

sexp sexp_sweep (sexp ctx, size_t *sum_freed_ptr) {
  size_t freed, max_freed=0, sum_freed=0, size;
  sexp_heap h = sexp_context_heap(ctx);
  sexp p, end;
  sexp_free_list q, r, s;
  /* scan over the whole heap */
  for ( ; h; h=h->next) {
    p = sexp_heap_first_block(h);
    q = h->free_list;
    end = sexp_heap_end(h);
    while (p < end) {
      /* find the preceding and succeeding free list pointers */
      for (r=q->next; r && ((char*)r<(char*)p); q=r, r=r->next)
        ;
      if ((char*)r == (char*)p) { /* this is a free block, skip it */
        p = (sexp) (((char*)p) + r->size);
        continue;
      }
      size = sexp_heap_align(sexp_allocated_bytes(ctx, p));
#if SEXP_USE_DEBUG_GC > 1
      if (!sexp_valid_object_p(ctx, p))
        fprintf(stderr, SEXP_BANNER("%p sweep: invalid object at %p"), ctx, p);
      if ((char*)q + q->size > (char*)p)
        fprintf(stderr, SEXP_BANNER("%p sweep: bad size at %p < %p + %lu"),
                ctx, p, q, q->size);
      if (r && ((char*)p)+size > (char*)r)
        fprintf(stderr, SEXP_BANNER("%p sweep: bad size at %p + %lu > %p"),
                ctx, p, size, r);
#endif
      if (!sexp_markedp(p)) {
        /* free p */
        sum_freed += size;
        if (((((char*)q) + q->size) == (char*)p) && (q != h->free_list)) {
          /* merge q with p */
          if (r && r->size && ((((char*)p)+size) == (char*)r)) {
            /* ... and with r */
            q->next = r->next;
            freed = q->size + size + r->size;
            p = (sexp) (((char*)p) + size + r->size);
          } else {
            freed = q->size + size;
            p = (sexp) (((char*)p)+size);
          }
          q->size = freed;
        } else {
          s = (sexp_free_list)p;
          if (r && r->size && ((((char*)p)+size) == (char*)r)) {
            /* merge p with r */
            s->size = size + r->size;
            s->next = r->next;
            q->next = s;
            freed = size + r->size;
          } else {
            s->size = size;
            s->next = r;
            q->next = s;
            freed = size;
          }
          p = (sexp) (((char*)p)+freed);
        }
        if (freed > max_freed)
          max_freed = freed;
      } else {
        sexp_markedp(p) = 0;
        p = (sexp) (((char*)p)+size);
      }
    }
  }
  if (sum_freed_ptr) *sum_freed_ptr = sum_freed;
  return sexp_make_fixnum(max_freed);
}